

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetPropertyQuery
          (JavascriptProxy *this,Var originalInstance,PropertyId propertyId,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  Type *this_00;
  ImplicitCallFlags IVar1;
  Type TVar2;
  ScriptContext *scriptContext;
  ThreadContext *this_01;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  PropertyQueryFlags PVar7;
  Attributes attributes;
  RecyclableObject *pRVar8;
  JavascriptFunction *pJVar9;
  Var pvVar10;
  JavascriptFunction *pJVar11;
  undefined4 *puVar12;
  PropertyDescriptor *this_02;
  PropertyDescriptor local_e8;
  undefined1 local_b8 [8];
  PropertyDescriptor result;
  char cStack_65;
  char cStack_64;
  char cStack_63;
  RecyclableObject *local_40;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = (RecyclableObject *)this;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
    *(undefined1 *)&info->cacheInfoFlag = (char)info->cacheInfoFlag | disablePrototypeCacheFlag;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_b8);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_01 = requestContext->threadContext;
  if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    pRVar8 = MarshalHandler(this,requestContext);
    if (pRVar8 != (RecyclableObject *)0x0) {
      pRVar8 = MarshalTarget(this,requestContext);
      pJVar9 = GetMethodHelper(this,0x198,requestContext);
      if ((pJVar9 == (JavascriptFunction *)0x0) ||
         (bVar4 = ScriptContext::IsHeapEnumInProgress(requestContext), bVar4)) {
        result.enumerableSpecified = false;
        BVar6 = JavascriptOperators::GetProperty
                          (originalInstance,pRVar8,propertyId,value,requestContext,
                           (PropertyValueInfo *)0x0);
        if (BVar6 == 0) goto LAB_00ba4b8c;
      }
      else {
        result.enumerableSpecified = true;
        pvVar10 = GetName(requestContext,propertyId);
        bVar4 = this_01->reentrancySafeOrHandled;
        this_01->reentrancySafeOrHandled = true;
        result._40_8_ = this_01;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)pJVar9);
        bVar5 = ThreadContext::HasNoSideEffect(this_01,(RecyclableObject *)pJVar9,attributes);
        if (bVar5) {
          local_40 = (RecyclableObject *)
                     anon_func::anon_class_48_6_e6283461::operator()
                               ((anon_class_48_6_e6283461 *)&result.Configurable);
          bVar5 = ThreadContext::IsOnStack(local_40);
LAB_00ba4c26:
          if (bVar5 != false) {
            this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            local_40 = (RecyclableObject *)
                       anon_func::anon_class_48_6_e6283461::operator()
                                 ((anon_class_48_6_e6283461 *)&result.Configurable);
            bVar5 = ThreadContext::IsOnStack(local_40);
            goto LAB_00ba4c26;
          }
          IVar1 = this_01->implicitCallFlags;
          local_40 = (RecyclableObject *)
                     anon_func::anon_class_48_6_e6283461::operator()
                               ((anon_class_48_6_e6283461 *)&result.Configurable);
          this_01->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          local_40 = (((((((((pJVar9->super_DynamicObject).super_RecyclableObject.type.ptr)->
                           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                       ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                     undefinedValue.ptr;
        }
        this_01->reentrancySafeOrHandled = bVar4;
        this_00 = &result.Configurable;
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)this_00);
        pJVar9 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
        BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                          (pRVar8,propertyId,requestContext,(PropertyDescriptor *)this_00);
        if (BVar6 != 0) {
          JavascriptOperators::CompletePropertyDescriptor
                    ((PropertyDescriptor *)this_00,(PropertyDescriptor *)0x0,requestContext);
          cStack_65 = (char)((ulong)pvVar10 >> 0x18);
          if (((cStack_65 != '\x01') ||
              (bVar4 = PropertyDescriptor::IsConfigurable
                                 ((PropertyDescriptor *)&result.Configurable), bVar4)) ||
             (bVar4 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&result.Configurable),
             bVar4)) {
            cStack_64 = (char)((ulong)pvVar10 >> 0x20);
            if (((cStack_64 != '\0') ||
                (cStack_63 = (char)((ulong)pvVar10 >> 0x28), cStack_63 == '\x01')) &&
               ((bVar4 = PropertyDescriptor::IsConfigurable
                                   ((PropertyDescriptor *)&result.Configurable), !bVar4 &&
                (pJVar11 = (JavascriptFunction *)
                           PropertyDescriptor::GetGetter((PropertyDescriptor *)&result.Configurable)
                , pJVar11 == pJVar9)))) {
              if (local_40 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar12 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
                if (!bVar4) goto LAB_00ba4f35;
                *puVar12 = 0;
              }
              bVar4 = TaggedInt::Is(local_40);
              if ((bVar4) || ((ulong)local_40 >> 0x32 != 0)) goto LAB_00ba4f21;
              pRVar8 = UnsafeVarTo<Js::RecyclableObject>(local_40);
              if (pRVar8 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar12 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar4) goto LAB_00ba4f35;
                *puVar12 = 0;
              }
              TVar2 = ((pRVar8->type).ptr)->typeId;
              if (0x57 < (int)TVar2) {
                BVar6 = RecyclableObject::IsExternal(pRVar8);
                if (BVar6 == 0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                  *puVar12 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                              ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                              "GetTypeId aValue has invalid TypeId");
                  if (!bVar4) {
LAB_00ba4f35:
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  *puVar12 = 0;
                }
LAB_00ba4f21:
                JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"get");
              }
              if (TVar2 != TypeIds_Undefined) goto LAB_00ba4f21;
            }
          }
          else {
            bVar4 = JavascriptConversion::SameValueCommon<false>(local_40,(Var)result._40_8_);
            if (!bVar4) goto LAB_00ba4f21;
          }
        }
        PropertyDescriptor::SetValue((PropertyDescriptor *)local_b8,local_40);
        this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
      }
      if (result.enumerableSpecified != true) {
        return Property_Found;
      }
      this_02 = &local_e8;
      PropertyDescriptor::PropertyDescriptor(&local_e8,(PropertyDescriptor *)local_b8);
      pRVar8 = (RecyclableObject *)
               GetValueFromDescriptor
                         ((JavascriptProxy *)this_02,originalInstance,&local_e8,requestContext);
      PVar7 = Property_Found;
      goto LAB_00ba4b99;
    }
    bVar4 = ThreadContext::RecordImplicitException(this_01);
    if (bVar4) {
      JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"get");
    }
  }
  else {
    this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
  }
LAB_00ba4b8c:
  pRVar8 = ScriptContext::GetMissingPropertyResult(requestContext);
  PVar7 = Property_NotFound;
LAB_00ba4b99:
  *value = pRVar8;
  return PVar7;
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetPropertyQuery(Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // We can't cache the property at this time. both target and handler can be changed outside of the proxy, so the inline cache needs to be
        // invalidate when target, handler, or handler prototype has changed. We don't have a way to achieve this yet.
        // Also, Get and Has operations share a cache, so a trap on either should prevent caching on both.
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetProperty(originalInstance, object, propertyId, value, requestContext, nullptr);
        };
        auto getPropertyId = [&]()->PropertyId {return propertyId; };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingPropertyResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }